

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsSamplerObjectTest.cpp
# Opt level: O2

char * deqp::gls::TextureSamplerTest::selectVertexShader(GLenum target)

{
  if (target == 0xde1) {
    return 
    "${VTX_HDR}${VTX_IN} ${HIGHP} vec2 a_position;\nuniform ${HIGHP} float u_posScale;\n${VTX_OUT} ${MEDIUMP} vec2 v_texCoord;\nvoid main (void)\n{\n\tv_texCoord = a_position;\n\tgl_Position = vec4(u_posScale * a_position, 0.0, 1.0);\n}"
    ;
  }
  if (target != 0x8513) {
    if (target == 0x806f) {
      return 
      "${VTX_HDR}${VTX_IN} ${HIGHP} vec3 a_position;\nuniform ${HIGHP} float u_posScale;\n${VTX_OUT} ${MEDIUMP} vec3 v_texCoord;\nvoid main (void)\n{\n\tv_texCoord = a_position;\n\tgl_Position = vec4(u_posScale * a_position.xy, 0.0, 1.0);\n}"
      ;
    }
    return (char *)0x0;
  }
  return 
  "${VTX_HDR}${VTX_IN} ${HIGHP} vec4 a_position;\nuniform ${HIGHP} float u_posScale;\n${VTX_OUT} ${MEDIUMP} vec2 v_texCoord;\nvoid main (void)\n{\n\tv_texCoord = a_position.zw;\n\tgl_Position = vec4(u_posScale * a_position.xy, 0.0, 1.0);\n}"
  ;
}

Assistant:

const char* TextureSamplerTest::selectVertexShader (GLenum target)
{
	switch (target)
	{
		case GL_TEXTURE_2D:
			return
			"${VTX_HDR}"
			"${VTX_IN} ${HIGHP} vec2 a_position;\n"
			"uniform ${HIGHP} float u_posScale;\n"
			"${VTX_OUT} ${MEDIUMP} vec2 v_texCoord;\n"
			"void main (void)\n"
			"{\n"
			"\tv_texCoord = a_position;\n"
			"\tgl_Position = vec4(u_posScale * a_position, 0.0, 1.0);\n"
			"}";

		case GL_TEXTURE_3D:
			return
			"${VTX_HDR}"
			"${VTX_IN} ${HIGHP} vec3 a_position;\n"
			"uniform ${HIGHP} float u_posScale;\n"
			"${VTX_OUT} ${MEDIUMP} vec3 v_texCoord;\n"
			"void main (void)\n"
			"{\n"
			"\tv_texCoord = a_position;\n"
			"\tgl_Position = vec4(u_posScale * a_position.xy, 0.0, 1.0);\n"
			"}";

		case GL_TEXTURE_CUBE_MAP:
			return
			"${VTX_HDR}"
			"${VTX_IN} ${HIGHP} vec4 a_position;\n"
			"uniform ${HIGHP} float u_posScale;\n"
			"${VTX_OUT} ${MEDIUMP} vec2 v_texCoord;\n"
			"void main (void)\n"
			"{\n"
			"\tv_texCoord = a_position.zw;\n"
			"\tgl_Position = vec4(u_posScale * a_position.xy, 0.0, 1.0);\n"
			"}";

		default:
			DE_ASSERT(false);
			return NULL;
	}
}